

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O2

void dg::pta::PointerAnalysisFS::mergeGlobalsState(MemoryMapT *mm,GlobalNodesT *globals)

{
  pointer ppPVar1;
  PSNode **glob;
  pointer ppPVar2;
  
  ppPVar1 = (globals->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar2 = (globals->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1;
      ppPVar2 = ppPVar2 + 1) {
    if (*(MemoryMapT **)(*ppPVar2 + 0x10) != (MemoryMapT *)0x0) {
      mergeMaps(mm,*(MemoryMapT **)(*ppPVar2 + 0x10),(PointsToSetT *)0x0);
    }
  }
  return;
}

Assistant:

static void mergeGlobalsState(MemoryMapT *mm,
                                  decltype(PG->getGlobals()) &globals) {
        for (const auto &glob : globals) {
            if (MemoryMapT *globmm = glob->getData<MemoryMapT>()) {
                mergeMaps(mm, globmm, nullptr);
            }
        }
    }